

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  U32 local_24;
  U32 local_20;
  U32 local_1c;
  ZSTD_compressionParameters *cParams_local;
  ldmParams_t *params_local;
  
  params->windowLog = cParams->windowLog;
  if (params->bucketSizeLog == 0) {
    params->bucketSizeLog = 3;
  }
  if (params->minMatchLength == 0) {
    params->minMatchLength = 0x40;
  }
  if (params->hashLog == 0) {
    if (params->windowLog - 7 < 6) {
      local_1c = 6;
    }
    else {
      local_1c = params->windowLog - 7;
    }
    params->hashLog = local_1c;
    if (0x1e < params->hashLog) {
      __assert_fail("params->hashLog <= ZSTD_HASHLOG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x91,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
  }
  if (params->hashRateLog == 0) {
    if (params->windowLog < params->hashLog) {
      local_20 = 0;
    }
    else {
      local_20 = params->windowLog - params->hashLog;
    }
    params->hashRateLog = local_20;
  }
  if (params->bucketSizeLog < params->hashLog) {
    local_24 = params->bucketSizeLog;
  }
  else {
    local_24 = params->hashLog;
  }
  params->bucketSizeLog = local_24;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}